

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O3

vector<despot::State_*,_std::allocator<despot::State_*>_> * __thiscall
despot::POMDPX::ApproxInitialParticleSet
          (vector<despot::State_*,_std::allocator<despot::State_*>_> *__return_storage_ptr__,
          POMDPX *this)

{
  void *pvVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  log_ostream *plVar5;
  undefined4 extraout_var;
  vector<int,_std::allocator<int>_> local_58;
  double local_38;
  pointer piVar6;
  
  (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar3 = logging::level();
  if (0 < iVar3) {
    iVar3 = logging::level();
    if (2 < iVar3) {
      plVar5 = logging::stream(3);
      std::__ostream_insert<char,std::char_traits<char>>
                (&plVar5->super_ostream,
                 "[POMDPX::ApproximatePrior] Drawing 1000 random particles from initial belief.",
                 0x4d);
      std::ios::widen((char)(plVar5->super_ostream)._vptr_basic_ostream[-3] + (char)plVar5);
      std::ostream::put((char)plVar5);
      std::ostream::flush();
    }
  }
  iVar3 = 1000;
  do {
    local_38 = Random::NextDouble((Random *)&Random::RANDOM);
    iVar4 = (*(this->super_MDP)._vptr_MDP[0x19])(0xd2f1a9fc,this,0xffffffff);
    piVar6 = (pointer)CONCAT44(extraout_var,iVar4);
    Parser::ComputeState(&local_58,this->parser_,local_38);
    pvVar1 = *(void **)(piVar6 + 8);
    lVar2 = *(long *)(piVar6 + 0xc);
    *(pointer *)(piVar6 + 8) =
         local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start;
    *(pointer *)(piVar6 + 10) =
         local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    *(pointer *)(piVar6 + 0xc) =
         local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,lVar2 - (long)pvVar1);
      if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = piVar6;
    std::vector<despot::State*,std::allocator<despot::State*>>::emplace_back<despot::State*>
              ((vector<despot::State*,std::allocator<despot::State*>> *)__return_storage_ptr__,
               (State **)&local_58);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  return __return_storage_ptr__;
}

Assistant:

vector<State*> POMDPX::ApproxInitialParticleSet() const {
	vector<State*> particles;

	logi
		<< "[POMDPX::ApproximatePrior] Drawing 1000 random particles from initial belief."
		<< endl;
	for (int i = 0; i < 1000; i++) {
		double random_value = Random::RANDOM.NextDouble();
		POMDPXState* state = static_cast<POMDPXState*>(Allocate(-1, 0.001));
		state->vec_id = parser_->ComputeState(random_value);
		particles.push_back(state);
	}

	return particles;
}